

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_0::SimpleInputStream::tryRead
          (SimpleInputStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  PromiseNode *extraout_RDX;
  ulong in_R8;
  ulong __n;
  Promise<unsigned_long> PVar1;
  
  __n = *(ulong *)((long)buffer + 0x10);
  if (in_R8 < *(ulong *)((long)buffer + 0x10)) {
    __n = in_R8;
  }
  memcpy((void *)minBytes,*(void **)((long)buffer + 8),__n);
  *(long *)((long)buffer + 8) = *(long *)((long)buffer + 8) + __n;
  *(long *)((long)buffer + 0x10) = *(long *)((long)buffer + 0x10) - __n;
  Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,__n);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    size_t amount = kj::min(maxBytes, unread.size());
    memcpy(buffer, unread.begin(), amount);
    unread = unread.slice(amount, unread.size());
    return amount;
  }